

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

MemoryRegion * __thiscall MT32Emu::Synth::findMemoryRegion(Synth *this,Bit32u addr)

{
  bool bVar1;
  int local_6c;
  int pos;
  MemoryRegion *regions [9];
  Bit32u addr_local;
  Synth *this_local;
  
  regions[8]._4_4_ = addr;
  regions[0] = &this->rhythmTempMemoryRegion->super_MemoryRegion;
  regions[1] = &this->timbreTempMemoryRegion->super_MemoryRegion;
  regions[2] = &this->patchesMemoryRegion->super_MemoryRegion;
  regions[3] = &this->timbresMemoryRegion->super_MemoryRegion;
  regions[4] = &this->systemMemoryRegion->super_MemoryRegion;
  regions[5] = &this->displayMemoryRegion->super_MemoryRegion;
  regions[6] = &this->resetMemoryRegion->super_MemoryRegion;
  regions[7] = (MemoryRegion *)0x0;
  local_6c = 0;
  while( true ) {
    if (regions[(long)local_6c + -1] == (MemoryRegion *)0x0) {
      return (MemoryRegion *)0x0;
    }
    bVar1 = MemoryRegion::contains(regions[(long)local_6c + -1],regions[8]._4_4_);
    if (bVar1) break;
    local_6c = local_6c + 1;
  }
  return regions[(long)local_6c + -1];
}

Assistant:

MemoryRegion *Synth::findMemoryRegion(Bit32u addr) {
	MemoryRegion *regions[] = {
		patchTempMemoryRegion,
		rhythmTempMemoryRegion,
		timbreTempMemoryRegion,
		patchesMemoryRegion,
		timbresMemoryRegion,
		systemMemoryRegion,
		displayMemoryRegion,
		resetMemoryRegion,
		NULL
	};
	for (int pos = 0; regions[pos] != NULL; pos++) {
		if (regions[pos]->contains(addr)) {
			return regions[pos];
		}
	}
	return NULL;
}